

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O0

void msdfgen::generatePseudoSDF_legacy
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  SignedDistance b;
  SignedDistance a;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pCVar4;
  reference this;
  EdgeSegment *pEVar5;
  float *pfVar6;
  EdgeHolder *extraout_XMM0_Qa;
  double dVar7;
  int local_114;
  SignedDistance distance;
  double param;
  __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_b0;
  const_iterator edge;
  __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_a0;
  const_iterator contour;
  double nearParam;
  EdgeHolder *nearEdge;
  SignedDistance minDistance;
  Vector2 local_68;
  undefined1 local_58 [8];
  Point2 p;
  int x;
  int row;
  int y;
  int h;
  int w;
  Vector2 *translate_local;
  Vector2 *scale_local;
  double range_local;
  Shape *shape_local;
  Bitmap<float> *output_local;
  
  iVar2 = Bitmap<float>::width(output);
  iVar3 = Bitmap<float>::height(output);
  for (x = 0; x < iVar3; x = x + 1) {
    if ((shape->inverseYAxis & 1U) == 0) {
      local_114 = x;
    }
    else {
      local_114 = (iVar3 - x) + -1;
    }
    for (p.y._4_4_ = 0; p.y._4_4_ < iVar2; p.y._4_4_ = p.y._4_4_ + 1) {
      Vector2::Vector2((Vector2 *)&minDistance.dot,(double)p.y._4_4_ + 0.5,(double)x + 0.5);
      local_68 = Vector2::operator/((Vector2 *)&minDistance.dot,scale);
      _local_58 = Vector2::operator-(&local_68,translate);
      SignedDistance::SignedDistance((SignedDistance *)&nearEdge);
      nearParam = 0.0;
      contour._M_current = (Contour *)0x0;
      local_a0._M_current =
           (Contour *)
           std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin(&shape->contours)
      ;
      while( true ) {
        edge._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::end(&shape->contours)
        ;
        bVar1 = __gnu_cxx::operator!=
                          (&local_a0,
                           (__normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                            *)&edge);
        if (!bVar1) break;
        pCVar4 = __gnu_cxx::
                 __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&local_a0);
        local_b0._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                       (&pCVar4->edges);
        while( true ) {
          pCVar4 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&local_a0);
          param = (double)std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                          end(&pCVar4->edges);
          bVar1 = __gnu_cxx::operator!=
                            (&local_b0,
                             (__normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                              *)&param);
          if (!bVar1) break;
          this = __gnu_cxx::
                 __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                 ::operator*(&local_b0);
          pEVar5 = EdgeHolder::operator->(this);
          dVar7 = p.x;
          (*pEVar5->_vptr_EdgeSegment[5])(local_58,pEVar5,&distance.dot);
          a.dot = dVar7;
          a.distance = (double)extraout_XMM0_Qa;
          b.dot = minDistance.distance;
          b.distance = (double)nearEdge;
          distance.distance = dVar7;
          bVar1 = operator<(a,b);
          if (bVar1) {
            minDistance.distance = distance.distance;
            nearEdge = extraout_XMM0_Qa;
            nearParam = (double)__gnu_cxx::
                                __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                                ::operator*(&local_b0);
            contour._M_current = (Contour *)distance.dot;
          }
          __gnu_cxx::
          __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
          ::operator++(&local_b0);
        }
        __gnu_cxx::
        __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
        ::operator++(&local_a0);
      }
      if (nearParam != 0.0) {
        pEVar5 = EdgeHolder::operator->((EdgeHolder *)nearParam);
        (*pEVar5->_vptr_EdgeSegment[6])(local_58,p.x,contour._M_current,pEVar5,&nearEdge);
      }
      dVar7 = (double)nearEdge / range;
      pfVar6 = Bitmap<float>::operator()(output,p.y._4_4_,local_114);
      *pfVar6 = (float)(dVar7 + 0.5);
    }
  }
  return;
}

Assistant:

void generatePseudoSDF_legacy(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int w = output.width(), h = output.height();
#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel for
#endif
    for (int y = 0; y < h; ++y) {
        int row = shape.inverseYAxis ? h-y-1 : y;
        for (int x = 0; x < w; ++x) {
            Point2 p = Vector2(x+.5, y+.5)/scale-translate;
            SignedDistance minDistance;
            const EdgeHolder *nearEdge = NULL;
            double nearParam = 0;
            for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
                for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                    double param;
                    SignedDistance distance = (*edge)->signedDistance(p, param);
                    if (distance < minDistance) {
                        minDistance = distance;
                        nearEdge = &*edge;
                        nearParam = param;
                    }
                }
            if (nearEdge)
                (*nearEdge)->distanceToPseudoDistance(minDistance, p, nearParam);
            output(x, row) = float(minDistance.distance/range+.5);
        }
    }
}